

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O0

bool vera::intersection(Line *_A,Line *_B,vec3 *_p,float _threshold)

{
  vec3 *pvVar1;
  vec3 *v2;
  vec<3,_float,_(glm::qualifier)0> *x;
  float extraout_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  vec<3,_float,_(glm::qualifier)0> vVar5;
  vec<3,_float,_(glm::qualifier)0> local_128;
  vec<3,_float,_(glm::qualifier)0> local_114;
  vec<3,_float,_(glm::qualifier)0> local_108;
  vec<3,_float,_(glm::qualifier)0> local_f8;
  vec<3,_float,_(glm::qualifier)0> local_e8;
  vec<3,_float,_(glm::qualifier)0> local_d8;
  vec<3,_float,_(glm::qualifier)0> local_c8;
  undefined8 local_b8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_b0;
  vec<3,_float,_(glm::qualifier)0> local_a8;
  vec<3,_float,_(glm::qualifier)0> local_98;
  float local_8c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aStack_88;
  float s;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_80;
  undefined1 local_74 [8];
  vec3 cross_da_db;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_60;
  undefined1 local_58 [8];
  vec3 dc;
  vec3 db;
  vec3 da;
  float _threshold_local;
  vec3 *_p_local;
  Line *_B_local;
  Line *_A_local;
  
  pvVar1 = Line::getDireciton(_A);
  db.field_2 = pvVar1->field_0;
  unique0x00012004 = pvVar1->field_1;
  pvVar1 = Line::getDireciton(_B);
  db.field_0 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)&pvVar1->field_2;
  dc.field_2 = pvVar1->field_0;
  unique0x00012004 = pvVar1->field_1;
  pvVar1 = Line::operator[](_B,0);
  v2 = Line::operator[](_A,0);
  vVar5 = glm::operator-(pvVar1,v2);
  local_60 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar5.field_2;
  dc.field_0 = local_60;
  cross_da_db._4_8_ = vVar5._0_8_;
  local_58._0_4_ = cross_da_db.field_1;
  local_58._4_4_ = cross_da_db.field_2;
  unique0x100002de = vVar5;
  vVar5 = glm::cross<float,(glm::qualifier)0>
                    ((vec<3,_float,_(glm::qualifier)0> *)&db.field_2,
                     (vec<3,_float,_(glm::qualifier)0> *)&dc.field_2);
  _aStack_88 = vVar5._0_8_;
  local_74._0_4_ = aStack_88;
  local_74._4_4_ = s;
  local_80 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar5.field_2;
  cross_da_db.field_0 = local_80;
  x = (vec<3,_float,_(glm::qualifier)0> *)local_58;
  _aStack_88 = vVar5;
  glm::dot<3,float,(glm::qualifier)0>(x,(vec<3,_float,_(glm::qualifier)0> *)local_74);
  std::abs((int)x);
  if (extraout_XMM0_Da <= _threshold) {
    vVar5 = glm::cross<float,(glm::qualifier)0>
                      ((vec<3,_float,_(glm::qualifier)0> *)local_58,
                       (vec<3,_float,_(glm::qualifier)0> *)&dc.field_2);
    local_a8._0_8_ = vVar5._0_8_;
    local_98.field_0 = local_a8.field_0;
    local_98.field_1 = local_a8.field_1;
    local_a8.field_2 = vVar5.field_2;
    local_98.field_2 = local_a8.field_2;
    local_a8 = vVar5;
    fVar2 = glm::dot<3,float,(glm::qualifier)0>
                      (&local_98,(vec<3,_float,_(glm::qualifier)0> *)local_74);
    local_8c = glm::length2<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)local_74)
    ;
    local_8c = fVar2 / local_8c;
    if ((0.0 <= local_8c) && (local_8c <= 1.0)) {
      pvVar1 = Line::operator[](_A,0);
      vVar5 = glm::operator*((vec<3,_float,_(glm::qualifier)0> *)&db.field_2,local_8c);
      local_d8.field_2 = vVar5.field_2;
      local_c8.field_2 = local_d8.field_2;
      local_d8._0_8_ = vVar5._0_8_;
      local_c8.field_0 = local_d8.field_0;
      local_c8.field_1 = local_d8.field_1;
      local_d8 = vVar5;
      vVar5 = glm::operator+(pvVar1,&local_c8);
      local_e8.field_2 = vVar5.field_2;
      local_b0 = local_e8.field_2;
      local_e8._0_8_ = vVar5._0_8_;
      local_b8._0_4_ = local_e8.field_0;
      local_b8._4_4_ = local_e8.field_1;
      _p->field_2 = local_e8.field_2;
      _p->field_0 = local_e8.field_0;
      _p->field_1 = local_e8.field_1;
      local_e8 = vVar5;
      pvVar1 = Line::operator[](_B,0);
      vVar5 = glm::operator-(_p,pvVar1);
      local_108.field_2 = vVar5.field_2;
      local_f8.field_2 = local_108.field_2;
      local_108._0_8_ = vVar5._0_8_;
      local_f8.field_0 = local_108.field_0;
      local_f8.field_1 = local_108.field_1;
      local_108 = vVar5;
      fVar2 = glm::length2<3,float,(glm::qualifier)0>(&local_f8);
      pvVar1 = Line::operator[](_B,1);
      vVar5 = glm::operator-(_p,pvVar1);
      local_128._0_8_ = vVar5._0_8_;
      local_114.field_0 = local_128.field_0;
      local_114.field_1 = local_128.field_1;
      local_128.field_2 = vVar5.field_2;
      local_114.field_2 = local_128.field_2;
      fVar3 = glm::length2<3,float,(glm::qualifier)0>(&local_114);
      pvVar1 = Line::getDireciton(_B);
      fVar4 = glm::length2<3,float,(glm::qualifier)0>(pvVar1);
      if (fVar2 + fVar3 <= fVar4 + 0.001) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool intersection(const Line& _A, const Line& _B, glm::vec3& _p, float _threshold ) {
    // Unnormalized direction of the ray
    glm::vec3 da = _A.getDireciton();
    glm::vec3 db = _B.getDireciton();
    glm::vec3 dc = _B[0] - _A[0];
    glm::vec3 cross_da_db = glm::cross(da, db);
    
    // lines are not coplanar
    if ( std::abs( glm::dot(dc, cross_da_db)) > _threshold)
        return false;
        
    // Means we have an intersection
    float s = glm::dot( glm::cross(dc, db),  cross_da_db) / glm::length2( cross_da_db );
    if (s >= 0.0 && s <= 1.0) {
        _p = _A[0] + da * s;
        
        // See if this lies on the segment
        if ( (glm::length2(_p - _B[0]) + glm::length2(_p - _B[1])) <= (glm::length2(_B.getDireciton()) + lengthErrorThreshold) )
            return true;
    }

    return false;
}